

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O1

void __thiscall
Omega_h::elements_across_sides_count_functor::elements_across_sides_count_functor
          (elements_across_sides_count_functor *this,Int nsides_per_elem_arg,
          Read<int> *elem_side2side_arg,Read<signed_char> *side_is_exposed_arg,
          Write<int> *degrees_arg)

{
  Alloc *pAVar1;
  
  this->nsides_per_elem = nsides_per_elem_arg;
  pAVar1 = (elem_side2side_arg->write_).shared_alloc_.alloc;
  (this->elem_side2side).write_.shared_alloc_.alloc = pAVar1;
  if (((ulong)pAVar1 & 7) == 0 && pAVar1 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      (this->elem_side2side).write_.shared_alloc_.alloc = (Alloc *)(pAVar1->size * 8 + 1);
    }
    else {
      pAVar1->use_count = pAVar1->use_count + 1;
    }
  }
  (this->elem_side2side).write_.shared_alloc_.direct_ptr =
       (elem_side2side_arg->write_).shared_alloc_.direct_ptr;
  pAVar1 = (side_is_exposed_arg->write_).shared_alloc_.alloc;
  (this->side_is_exposed).write_.shared_alloc_.alloc = pAVar1;
  if (((ulong)pAVar1 & 7) == 0 && pAVar1 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      (this->side_is_exposed).write_.shared_alloc_.alloc = (Alloc *)(pAVar1->size * 8 + 1);
    }
    else {
      pAVar1->use_count = pAVar1->use_count + 1;
    }
  }
  (this->side_is_exposed).write_.shared_alloc_.direct_ptr =
       (side_is_exposed_arg->write_).shared_alloc_.direct_ptr;
  pAVar1 = (degrees_arg->shared_alloc_).alloc;
  (this->degrees).shared_alloc_.alloc = pAVar1;
  if (((ulong)pAVar1 & 7) == 0 && pAVar1 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      (this->degrees).shared_alloc_.alloc = (Alloc *)(pAVar1->size * 8 + 1);
    }
    else {
      pAVar1->use_count = pAVar1->use_count + 1;
    }
  }
  (this->degrees).shared_alloc_.direct_ptr = (degrees_arg->shared_alloc_).direct_ptr;
  return;
}

Assistant:

elements_across_sides_count_functor(
      Int nsides_per_elem_arg,
      Read<LO> const& elem_side2side_arg,
      Read<I8> const& side_is_exposed_arg,
      Write<LO> const& degrees_arg
      )
    :nsides_per_elem(nsides_per_elem_arg)
    ,elem_side2side(elem_side2side_arg)
    ,side_is_exposed(side_is_exposed_arg)
    ,degrees(degrees_arg)
  {}